

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.cc
# Opt level: O3

float __thiscall webrtc::Agc::AnalyzePreproc(Agc *this,int16_t *audio,size_t length)

{
  ulong uVar1;
  size_t i;
  size_t sVar2;
  
  if (length != 0) {
    sVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + ((ushort)(audio[sVar2] + 0x8001U) < 2);
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
    return (float)uVar1 / (float)length;
  }
  __assert_fail("length > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/agc/agc.cc"
                ,0x2b,"virtual float webrtc::Agc::AnalyzePreproc(const int16_t *, size_t)");
}

Assistant:

float Agc::AnalyzePreproc(const int16_t* audio, size_t length) {
  assert(length > 0);
  size_t num_clipped = 0;
  for (size_t i = 0; i < length; ++i) {
    if (audio[i] == 32767 || audio[i] == -32768)
      ++num_clipped;
  }
  return 1.0f * num_clipped / length;
}